

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::GetTransitivePropertiesOnly(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *local_20;
  cmGeneratorExpressionDAGChecker *parent;
  cmGeneratorExpressionDAGChecker *top;
  cmGeneratorExpressionDAGChecker *this_local;
  
  parent = this;
  for (local_20 = this->Parent; local_20 != (cmGeneratorExpressionDAGChecker *)0x0;
      local_20 = local_20->Parent) {
    parent = local_20;
  }
  return (bool)(parent->TransitivePropertiesOnly & 1);
}

Assistant:

bool cmGeneratorExpressionDAGChecker::GetTransitivePropertiesOnly()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  return top->TransitivePropertiesOnly;
}